

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

Object * __thiscall pstack::Elf::Object::getDebug(Object *this)

{
  Context *pCVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  reference object;
  element_type *peVar7;
  undefined4 extraout_var_00;
  byte *pbVar8;
  undefined4 extraout_var_01;
  Section *pSVar9;
  ostream *poVar10;
  element_type *peVar11;
  element_type *peVar12;
  void *pvVar13;
  reference this_00;
  pointer pSVar14;
  reference ppVar15;
  reference paVar16;
  Reader *things;
  anon_struct_56_8_fb3e104e *sect_1;
  iterator __end4;
  iterator __begin4;
  vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *__range4;
  pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_> *sectType;
  iterator __end3_1;
  iterator __begin3_1;
  map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
  *__range3_1;
  unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_> *sect;
  iterator __end3;
  iterator __begin3;
  SectionHeaders *__range3;
  IOFlagSave _;
  Addr diff;
  string local_438;
  Section *local_418;
  Section *d;
  string local_408;
  Section *local_3e8;
  Section *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  undefined1 local_3a0 [16];
  string local_390;
  undefined1 local_370 [8];
  string dir_1;
  undefined1 local_340 [8];
  string link;
  string local_318;
  Section *local_2f8;
  Section *hdr;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [8];
  csptr io;
  size_t i;
  ostringstream dir;
  string local_120;
  NoteDesc local_100;
  NoteDesc *local_e0;
  NoteDesc *note;
  undefined1 local_d0 [8];
  iterator __end2;
  iterator __begin2;
  Notes local_40;
  Notes *local_38;
  Notes *__range2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buildID;
  Object *this_local;
  
  buildID.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (((this->debugLoaded & 1U) == 0) && (((this->context->options).noExtDebug & 1U) == 0)) {
    this->debugLoaded = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2);
    local_40 = notes(this);
    local_38 = &local_40;
    Notes::begin((iterator *)
                 &__end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,local_38);
    Notes::end((iterator *)local_d0,local_38);
    while (bVar4 = Notes::iterator::operator!=
                             ((iterator *)
                              &__end2.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,(iterator *)local_d0), bVar4) {
      Notes::iterator::operator*
                (&local_100,
                 (iterator *)
                 &__end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_e0 = &local_100;
      NoteDesc::name_abi_cxx11_(&local_120,local_e0);
      bVar5 = std::operator==(&local_120,"GNU");
      bVar4 = false;
      if (bVar5) {
        iVar6 = NoteDesc::type(local_e0);
        bVar4 = iVar6 == 3;
      }
      std::__cxx11::string::~string((string *)&local_120);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
        std::operator<<((ostream *)&i,".build-id/");
        NoteDesc::data((NoteDesc *)local_2b0);
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_2b0);
        iVar6 = (*peVar11->_vptr_Reader[8])();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2,
                   CONCAT44(extraout_var,iVar6));
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_2b0);
        object = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2,0);
        peVar7 = std::
                 __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2b0);
        iVar6 = (*peVar7->_vptr_Reader[8])();
        Reader::readObj<unsigned_char>(peVar11,0,object,CONCAT44(extraout_var_00,iVar6));
        poVar10 = (ostream *)std::ostream::operator<<(&i,std::hex);
        local_2d0._28_4_ = std::setw(2);
        poVar10 = std::operator<<(poVar10,(_Setw)local_2d0._28_4_);
        local_2d0[0x1b] = std::setfill<char>('0');
        poVar10 = std::operator<<(poVar10,local_2d0[0x1b]);
        pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2,0);
        std::ostream::operator<<(poVar10,(uint)*pbVar8);
        std::operator<<((ostream *)&i,"/");
        io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        while( true ) {
          _Var3._M_pi = io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar11 = std::
                    __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_2b0);
          iVar6 = (*peVar11->_vptr_Reader[8])();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var_01,iVar6) <=
              _Var3._M_pi) break;
          local_2d0._20_4_ = std::setw(2);
          poVar10 = std::operator<<((ostream *)&i,(_Setw)local_2d0._20_4_);
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2,
                              (size_type)
                              io.
                              super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
          std::ostream::operator<<(poVar10,(uint)*pbVar8);
          io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
        }
        poVar10 = std::operator<<((ostream *)&i,".debug");
        std::ostream::operator<<(poVar10,std::dec);
        pCVar1 = this->context;
        std::__cxx11::ostringstream::str();
        Context::getDebugImage((Context *)local_2d0,(string *)pCVar1);
        std::shared_ptr<pstack::Elf::Object>::operator=
                  (&this->debugObject,(shared_ptr<pstack::Elf::Object> *)local_2d0);
        std::shared_ptr<pstack::Elf::Object>::~shared_ptr
                  ((shared_ptr<pstack::Elf::Object> *)local_2d0);
        std::__cxx11::string::~string((string *)&hdr);
        note._4_4_ = 2;
        std::shared_ptr<const_pstack::Reader>::~shared_ptr
                  ((shared_ptr<const_pstack::Reader> *)local_2b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
      }
      else {
        note._4_4_ = 0;
      }
      NoteDesc::~NoteDesc(&local_100);
      if (note._4_4_ != 0) goto LAB_00285c17;
      Notes::iterator::operator++
                ((iterator *)
                 &__end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    note._4_4_ = 2;
LAB_00285c17:
    Notes::iterator::~iterator((iterator *)local_d0);
    Notes::iterator::~iterator
              ((iterator *)
               &__end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->debugObject);
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,".gnu_debuglink",
                 (allocator<char> *)(link.field_2._M_local_buf + 0xf));
      pSVar9 = getSection(this,&local_318,1);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator((allocator<char> *)(link.field_2._M_local_buf + 0xf));
      local_2f8 = pSVar9;
      bVar4 = Section::operator_cast_to_bool(pSVar9);
      if (bVar4) {
        Section::io((Section *)((long)&dir_1.field_2 + 8));
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)(dir_1.field_2._M_local_buf + 8));
        (*peVar11->_vptr_Reader[7])(local_340,peVar11,0);
        std::shared_ptr<const_pstack::Reader>::~shared_ptr
                  ((shared_ptr<const_pstack::Reader> *)((long)&dir_1.field_2 + 8));
        pCVar1 = this->context;
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->io);
        stringify<pstack::Reader_const&>((string *)(local_3a0 + 0x10),(pstack *)peVar11,things);
        Context::dirname((Context *)local_370,(char *)pCVar1);
        std::__cxx11::string::~string((string *)(local_3a0 + 0x10));
        pCVar1 = this->context;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_370,"/");
        std::operator+(&local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_340);
        Context::getDebugImage((Context *)local_3a0,(string *)pCVar1);
        std::shared_ptr<pstack::Elf::Object>::operator=
                  (&this->debugObject,(shared_ptr<pstack::Elf::Object> *)local_3a0);
        std::shared_ptr<pstack::Elf::Object>::~shared_ptr
                  ((shared_ptr<pstack::Elf::Object> *)local_3a0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&s);
        std::__cxx11::string::~string((string *)local_370);
        std::__cxx11::string::~string((string *)local_340);
      }
    }
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->debugObject);
    if (bVar4) {
      if (1 < this->context->verbose) {
        poVar10 = std::operator<<(this->context->debug,"found debug object ");
        peVar12 = std::
                  __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->debugObject);
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar12->io);
        poVar10 = pstack::operator<<(poVar10,peVar11);
        poVar10 = std::operator<<(poVar10," for ");
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->io);
        poVar10 = pstack::operator<<(poVar10,peVar11);
        std::operator<<(poVar10,"\n");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,".dynamic",(allocator<char> *)((long)&d + 7));
      pSVar9 = getSection(this,&local_408,0);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator((allocator<char> *)((long)&d + 7));
      local_3e8 = pSVar9;
      peVar12 = std::
                __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->debugObject);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,".dynamic",(allocator<char> *)((long)&diff + 7));
      pSVar9 = getSection(peVar12,&local_438,0);
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator((allocator<char> *)((long)&diff + 7));
      local_418 = pSVar9;
      if (((pSVar9->shdr).sh_addr != (local_3e8->shdr).sh_addr) &&
         (this->context->debug != (ostream *)0x0)) {
        _._264_8_ = (local_3e8->shdr).sh_addr - (pSVar9->shdr).sh_addr;
        poVar10 = this->context->debug;
        IOFlagSave::IOFlagSave
                  ((IOFlagSave *)&__range3,(ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)));
        poVar10 = std::operator<<(this->context->debug,"warning: dynamic section for debug symbols "
                                 );
        peVar12 = std::
                  __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->debugObject);
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar12->io);
        poVar10 = pstack::operator<<(poVar10,peVar11);
        poVar10 = std::operator<<(poVar10," loaded for object ");
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->io);
        poVar10 = pstack::operator<<(poVar10,peVar11);
        poVar10 = std::operator<<(poVar10," at different offset: diff is ");
        pvVar13 = (void *)std::ostream::operator<<(poVar10,std::hex);
        poVar10 = (ostream *)std::ostream::operator<<(pvVar13,_._264_8_);
        poVar10 = std::operator<<(poVar10,", assuming ");
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->io);
        poVar10 = pstack::operator<<(poVar10,peVar11);
        poVar10 = std::operator<<(poVar10," is prelinked");
        pvVar13 = (void *)std::ostream::operator<<(poVar10,std::dec);
        std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
        peVar12 = std::
                  __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->debugObject);
        __end3 = std::
                 vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
                 ::begin(&peVar12->sectionHeaders);
        sect = (unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_> *)
               std::
               vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
               ::end(&peVar12->sectionHeaders);
        while (bVar4 = __gnu_cxx::
                       operator==<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_*,_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>
                                 (&__end3,(__normal_iterator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_*,_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>
                                           *)&sect), ((bVar4 ^ 0xffU) & 1) != 0) {
          this_00 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_*,_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>
                    ::operator*(&__end3);
          uVar2 = _._264_8_;
          pSVar14 = std::
                    unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>::
                    operator->(this_00);
          (pSVar14->shdr).sh_addr = uVar2 + (pSVar14->shdr).sh_addr;
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_*,_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>
          ::operator++(&__end3);
        }
        peVar12 = std::
                  __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->debugObject);
        __end3_1 = std::
                   map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
                   ::begin(&peVar12->programHeaders);
        sectType = (pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                    *)std::
                      map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
                      ::end(&peVar12->programHeaders);
        while (bVar4 = std::operator==(&__end3_1,(_Self *)&sectType), ((bVar4 ^ 0xffU) & 1) != 0) {
          ppVar15 = std::
                    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>
                    ::operator*(&__end3_1);
          __end4 = std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::begin(&ppVar15->second);
          sect_1 = (anon_struct_56_8_fb3e104e *)
                   std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::end(&ppVar15->second);
          while (bVar4 = __gnu_cxx::
                         operator==<Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                                   (&__end4,(__normal_iterator<Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                                             *)&sect_1), ((bVar4 ^ 0xffU) & 1) != 0) {
            paVar16 = __gnu_cxx::
                      __normal_iterator<Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                      ::operator*(&__end4);
            paVar16->p_vaddr = _._264_8_ + paVar16->p_vaddr;
            __gnu_cxx::
            __normal_iterator<Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>::
            operator++(&__end4);
          }
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>
          ::operator++(&__end3_1);
        }
        IOFlagSave::~IOFlagSave((IOFlagSave *)&__range3);
      }
      this_local = std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(this->debugObject).
                               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      if (1 < this->context->verbose) {
        poVar10 = std::operator<<(this->context->debug,"no debug object for ");
        peVar11 = std::
                  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->io);
        poVar10 = pstack::operator<<(poVar10,peVar11);
        std::operator<<(poVar10,"\n");
      }
      this_local = (Object *)0x0;
    }
    note._4_4_ = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2);
  }
  else {
    this_local = std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->debugObject).
                             super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>);
  }
  return this_local;
}

Assistant:

Object *
Object::getDebug() const
{
    if (debugLoaded || context.options.noExtDebug)
        return debugObject.get();
    debugLoaded = true;

    // Use the build ID to find debug data.
    std::vector<unsigned char> buildID;
    for (const auto &note : notes()) {
        if (note.name() == "GNU" && note.type() == GNU_BUILD_ID) {
            std::ostringstream dir;
            dir << ".build-id/";
            size_t i;
            auto io = note.data();
            buildID.resize(io->size());
            io->readObj(0, &buildID[0], io->size());
            dir << std::hex << std::setw(2) << std::setfill('0') << int(buildID[0]);
            dir << "/";
            for (i = 1; i < size_t(io->size()); ++i)
                dir << std::setw(2) << int(buildID[i]);
            dir << ".debug" << std::dec;
            debugObject = context.getDebugImage(dir.str());
            break;
        }
    }

    // If that doesn't work, maybe the gnu_debuglink is valid?
    if (!debugObject) {
        // if we have a debug link, use that to attempt to find the debug file.
        auto &hdr = getSection(".gnu_debuglink", SHT_PROGBITS);
        if (hdr) {
            auto link = hdr.io()->readString(0);
            auto dir = context.dirname(stringify(*io));
            debugObject = context.getDebugImage(dir + "/" + link); //
        }
    }

#ifdef DEBUGINFOD
   if (!debugObject && buildID.size() && context.debuginfod) {
      char *path;
      int fd = debuginfod_find_debuginfo(
            context.debuginfod.get(),
            buildID.data(),
            int( buildID.size() ),
            &path );
      if (fd >= 0) {
         std::shared_ptr<Reader> reader = std::make_shared<FileReader>(context, path, fd );
         reader = std::make_shared<CacheReader>(reader);
         debugObject = std::make_shared<Elf::Object>( context, reader, true );
         free(path);
      } else if (context.verbose) {
         *context.debug << "failed to fetch debuginfo with debuginfod: " << strerror(-fd) << "\n";
      }
   }
#endif

    if (!debugObject) {
        if (context.verbose >= 2)
           *context.debug << "no debug object for " << *this->io << "\n";
        return nullptr;
    }

    if (context.verbose >= 2)
        *context.debug << "found debug object " << *debugObject->io << " for " << *io << "\n";

    // Validate that the .dynamic section in the debug object and the one in
    // the original image have the same .sh_addr.
    auto &s = getSection(".dynamic", SHT_NULL);
    auto &d = debugObject->getSection(".dynamic", SHT_NULL);

    if (d.shdr.sh_addr != s.shdr.sh_addr && context.debug) {
        Elf::Addr diff = s.shdr.sh_addr - d.shdr.sh_addr;
        IOFlagSave _(*context.debug);
        *context.debug << "warning: dynamic section for debug symbols "
           << *debugObject->io << " loaded for object "
           << *this->io << " at different offset: diff is "
           << std::hex << diff
           << ", assuming " << *this->io << " is prelinked" << std::dec << std::endl;

        // looks like the exe has been prelinked - adjust the debug info too.
        for (auto &sect : debugObject->sectionHeaders)
            sect->shdr.sh_addr += diff;

        for (auto &sectType : debugObject->programHeaders)
            for (auto &sect : sectType.second)
                sect.p_vaddr += diff;
    }
    return debugObject.get();
}